

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.c
# Opt level: O1

void sim(void)

{
  _func_Card_ptr_ptr_unsigned_long_ptr *p_Var1;
  _func_Board_ptr_Card_ptr_ptr_unsigned_long *p_Var2;
  _func_MovePack_ptr_Board_ptr *p_Var3;
  pthread_t __th;
  Move *pMVar4;
  long lVar5;
  Results RVar6;
  uchar cardsCount_00;
  int iVar7;
  int iVar8;
  Results *pRVar9;
  Card **cards;
  Board *pBVar10;
  char *pcVar11;
  MovePack *movePack;
  char *pcVar12;
  undefined8 extraout_RAX;
  unsigned_long uVar13;
  int iVar14;
  Results *pRVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  code *pcVar19;
  bool bVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar23 [16];
  undefined1 in_ZMM1 [64];
  double adStack_98 [3];
  ulong auStack_80 [4];
  Results aRStack_60 [2];
  Results *results;
  Results *local_48;
  unsigned_long local_40;
  unsigned_long cardsCount;
  
  lVar5 = -(gConfig.threadCount * 8 + 0xf & 0xfffffffffffffff0);
  results = (Results *)((long)aRStack_60 + lVar5 + 8);
  *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107238;
  pRVar9 = results_create();
  local_40 = 0;
  p_Var1 = (gConfig.game)->deckCreate;
  if (p_Var1 == (_func_Card_ptr_ptr_unsigned_long_ptr *)0x0) {
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107260;
    cards = game_deckCreate(&local_40);
  }
  else {
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107259;
    cards = (*p_Var1)(&local_40);
  }
  if (gConfig.json == true) {
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107277;
    printf("{\"deck\":");
    cardsCount_00 = (uchar)local_40;
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107283;
    cards_printAsDeck(cards,cardsCount_00);
  }
  uVar13 = local_40;
  p_Var2 = (gConfig.game)->boardCreate;
  *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107294;
  pBVar10 = (*p_Var2)(cards,uVar13);
  cardsCount = (unsigned_long)pBVar10;
  *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1072a0;
  pBVar10 = board_dup(pBVar10);
  *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1072ab;
  free(cards);
  if ((gConfig.json == false) && (gConfig.printSolution == false)) {
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1072c9;
    pcVar11 = comma_print(gConfig.iterationCount);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1072da;
    printf("\x1b[35mTotal Iterations: \x1b[36m%s\x1b[0m\n",pcVar11);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1072e3;
    pcVar11 = comma_print(gConfig.maxDepth);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1072f4;
    printf("\x1b[35m   Maximum Depth: \x1b[36m%s\x1b[0m\n",pcVar11);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1072fd;
    pcVar11 = comma_print(gConfig.threadCount);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x10730e;
    printf("\x1b[35m    Thread Count: \x1b[36m%s\x1b[0m\n",pcVar11);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107318;
    putchar(10);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x10732d;
    printf("\x1b[35m            Game: \x1b[36m%s\x1b[0m\n",(gConfig.game)->idname);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x10733f;
    printf("\x1b[35m            Seed: \x1b[36m%u\x1b[0m\n");
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107349;
    putchar(10);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107355;
    puts("\x1b[35m           Board: \x1b[0m");
    uVar13 = cardsCount;
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107363;
    board_print((Board *)uVar13,false);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x10736d;
    putchar(10);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107379;
    puts("\x1b[35m  Starting Moves:\x1b[0m");
    p_Var3 = (gConfig.game)->movePackGet;
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107386;
    movePack = (*p_Var3)((Board *)uVar13);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107399;
    movePack_print((Board *)uVar13,movePack,false);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1073a9;
    movePack_free(movePack,true);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1073b3;
    putchar(10);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1073bf;
    puts("\x1b[37m        <<<=== \x1b[32mRUNNING\x1b[37m ===>>>\x1b[0m");
  }
  uVar13 = cardsCount;
  auVar23 = in_ZMM1._0_16_;
  auVar22 = in_ZMM0._0_16_;
  if (gConfig.threadCount < 2) {
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107462;
    pRVar9 = (Results *)depthFirstThread((void *)uVar13);
  }
  else {
    local_48 = pRVar9;
    if (gConfig.threadCount != 0) {
      uVar17 = 0;
      pcVar19 = depthFirstThread;
      pRVar9 = results;
      do {
        uVar13 = cardsCount;
        pRVar15 = (Results *)0x0;
        *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1073f7;
        iVar7 = pthread_create(&pRVar9->winCount,(pthread_attr_t *)0x0,depthFirstThread,
                               (void *)uVar13);
        if (iVar7 != 0) {
          *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107599;
          sim_cold_1();
          goto LAB_00107599;
        }
        uVar17 = uVar17 + 1;
        pRVar9 = pRVar9 + 1;
      } while (uVar17 < gConfig.threadCount);
    }
    pRVar9 = local_48;
    auVar23 = in_ZMM1._0_16_;
    auVar22 = in_ZMM0._0_16_;
    if (gConfig.threadCount != 0) {
      uVar17 = 0;
      pcVar19 = (code *)(aRStack_60 + 1);
      do {
        __th = results[uVar17].winCount;
        *(undefined8 *)((long)aRStack_60 + lVar5) = 0x10742e;
        pRVar15 = (Results *)pcVar19;
        iVar7 = pthread_join(__th,(void **)pcVar19);
        RVar6.winCount = aRStack_60[1].winCount;
        if (iVar7 != 0) goto LAB_00107599;
        *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107442;
        results_add((Results *)RVar6.winCount,pRVar9);
        RVar6.winCount = aRStack_60[1].winCount;
        *(undefined8 *)((long)aRStack_60 + lVar5) = 0x10744b;
        results_free((Results *)RVar6.winCount);
        auVar23 = in_ZMM1._0_16_;
        auVar22 = in_ZMM0._0_16_;
        uVar17 = uVar17 + 1;
      } while (uVar17 < gConfig.threadCount);
    }
  }
  if (gConfig.json == false) {
    uVar13 = pRVar9->winCount;
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1074a3;
    pcVar11 = comma_print(uVar13);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1074b2;
    pcVar12 = comma_print(gConfig.iterationCount);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1074c9;
    printf("\x1b[35m       Win Count: \x1b[33m%s\x1b[35m out of \x1b[33m%s\x1b[0m\n",pcVar11,pcVar12
          );
    auVar22 = vcvtusi2sd_avx512f(auVar22,pRVar9->winCount);
    auVar23 = vcvtusi2sd_avx512f(auVar23,gConfig.iterationCount);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1074f1;
    printf("\x1b[35m  Win Percentage: \x1b[33m%0.4f%%\x1b[0m\n",
           (auVar22._0_8_ / auVar23._0_8_) * 100.0);
  }
  else {
    uVar13 = pRVar9->winCount;
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x10748d;
    printf(",\"seed\":%u,\"wins\":%lu,\"games\":%lu",(ulong)gConfig.seed,uVar13,
           gConfig.iterationCount);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107499;
    puts("}");
  }
  if ((gConfig.printSolution == true) && (winningMoves != (MovePack *)0x0)) {
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107511;
    puts("\nWinning moves:");
    uVar13 = winningMoves->movesCount;
    do {
      pMVar4 = winningMoves->moves[uVar13 - 1];
      *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107538;
      move_print(pBVar10,pMVar4,true);
      pMVar4 = winningMoves->moves[uVar13 - 1];
      *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107550;
      board_moveMake(pBVar10,pMVar4);
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
    *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107566;
    movePack_free(winningMoves,true);
  }
  uVar13 = cardsCount;
  *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107572;
  board_free((Board *)uVar13);
  *(undefined8 *)((long)aRStack_60 + lVar5) = 0x10757a;
  board_free(pBVar10);
  *(undefined8 *)((long)aRStack_60 + lVar5) = 0x107582;
  results_free(pRVar9);
  return;
LAB_00107599:
  *(undefined8 *)((long)aRStack_60 + lVar5) = 0x1075a1;
  uVar16 = uVar17;
  sim_cold_2();
  *(undefined1 **)((long)aRStack_60 + lVar5) = &stack0xfffffffffffffff8;
  *(Board **)((long)auStack_80 + lVar5 + 0x18) = pBVar10;
  *(code **)((long)auStack_80 + lVar5 + 0x10) = pcVar19;
  *(Config **)((long)auStack_80 + lVar5 + 8) = &gConfig;
  *(ulong *)((long)auStack_80 + lVar5) = uVar17;
  *(Results **)((long)adStack_98 + lVar5 + 0x10) = pRVar9;
  *(undefined8 *)((long)adStack_98 + lVar5 + 8) = extraout_RAX;
  *(undefined8 *)((long)adStack_98 + lVar5) = 0x1075ba;
  dVar21 = getTicks();
  *(double *)((long)adStack_98 + lVar5 + 8) = dVar21;
  *(undefined8 *)((long)adStack_98 + lVar5) = 0x1075c4;
  games_load();
  gConfig.json = false;
  gConfig.iterationCount = 0;
  *(undefined8 *)((long)adStack_98 + lVar5) = 0x1075df;
  gConfig.threadCount = sysconf(0x54);
  gConfig.seed = 0;
  gConfig.maxDepth = 0;
  gConfig.game = (Game *)0x0;
  gConfig.printSolution = false;
  iVar7 = 1;
  iVar18 = (int)uVar16;
  if (1 < iVar18) {
    iVar14 = iVar18 + -1;
    do {
      pcVar11 = (char *)pRVar15[iVar7].winCount;
      *(undefined8 *)((long)adStack_98 + lVar5) = 0x107636;
      iVar8 = strcmp(pcVar11,"-h");
      if (iVar8 == 0) goto LAB_0010786f;
      *(undefined8 *)((long)adStack_98 + lVar5) = 0x10764d;
      iVar8 = strcmp(pcVar11,"--help");
      if (iVar8 == 0) goto LAB_0010786f;
      *(undefined8 *)((long)adStack_98 + lVar5) = 0x107664;
      iVar8 = strcmp(pcVar11,"-V");
      if (iVar8 == 0) goto LAB_00107874;
      *(undefined8 *)((long)adStack_98 + lVar5) = 0x10767b;
      iVar8 = strcmp(pcVar11,"--version");
      if (iVar8 == 0) goto LAB_00107874;
      *(undefined8 *)((long)adStack_98 + lVar5) = 0x10768e;
      iVar8 = strcmp(pcVar11,"--json");
      if (iVar8 == 0) {
        gConfig.json = true;
LAB_00107797:
        bVar20 = true;
      }
      else {
        *(undefined8 *)((long)adStack_98 + lVar5) = 0x1076a1;
        iVar8 = strcmp(pcVar11,"--printSolution");
        if (iVar8 == 0) {
          gConfig.printSolution = true;
          goto LAB_00107797;
        }
        *(undefined8 *)((long)adStack_98 + lVar5) = 0x1076b4;
        iVar8 = strcmp(pcVar11,"--iterations");
        if ((iVar7 != iVar14) && (iVar8 == 0)) {
          bVar20 = SCARRY4(iVar7,1);
          iVar7 = iVar7 + 1;
          if (bVar20) goto LAB_00107890;
          pcVar11 = (char *)pRVar15[iVar7].winCount;
          *(undefined8 *)((long)adStack_98 + lVar5) = 0x1076d2;
          gConfig.iterationCount = atol(pcVar11);
          goto LAB_00107797;
        }
        *(undefined8 *)((long)adStack_98 + lVar5) = 0x107705;
        iVar8 = strcmp(pcVar11,"--maxDepth");
        if ((iVar7 != iVar14) && (iVar8 == 0)) {
          bVar20 = SCARRY4(iVar7,1);
          iVar7 = iVar7 + 1;
          if (bVar20) goto LAB_00107890;
          pcVar11 = (char *)pRVar15[iVar7].winCount;
          *(undefined8 *)((long)adStack_98 + lVar5) = 0x107723;
          gConfig.maxDepth = atol(pcVar11);
          goto LAB_00107797;
        }
        *(undefined8 *)((long)adStack_98 + lVar5) = 0x10773b;
        iVar8 = strcmp(pcVar11,"--threads");
        if ((iVar7 != iVar14) && (iVar8 == 0)) {
          bVar20 = SCARRY4(iVar7,1);
          iVar7 = iVar7 + 1;
          if (bVar20) goto LAB_00107890;
          pcVar11 = (char *)pRVar15[iVar7].winCount;
          *(undefined8 *)((long)adStack_98 + lVar5) = 0x107759;
          gConfig.threadCount = atol(pcVar11);
          goto LAB_00107797;
        }
        *(undefined8 *)((long)adStack_98 + lVar5) = 0x107771;
        iVar8 = strcmp(pcVar11,"--seed");
        bVar20 = false;
        if ((iVar7 != iVar14) && (iVar8 == 0)) {
          bVar20 = SCARRY4(iVar7,1);
          iVar7 = iVar7 + 1;
          if (bVar20) goto LAB_00107890;
          pcVar11 = (char *)pRVar15[iVar7].winCount;
          *(undefined8 *)((long)adStack_98 + lVar5) = 0x107791;
          gConfig.seed = atoi(pcVar11);
          goto LAB_00107797;
        }
      }
      if (!bVar20) break;
      bVar20 = SCARRY4(iVar7,1);
      iVar7 = iVar7 + 1;
      if (bVar20) {
LAB_00107890:
        pcVar19 = (code *)invalidInstructionException();
        (*pcVar19)();
      }
    } while (iVar7 < iVar18);
  }
  if (SBORROW4(iVar18,iVar7)) {
    pcVar19 = (code *)invalidInstructionException();
    (*pcVar19)();
  }
  if (iVar18 != iVar7) {
    pcVar11 = (char *)pRVar15[iVar7].winCount;
    *(undefined8 *)((long)adStack_98 + lVar5) = 0x1077ca;
    gConfig.game = find_game(pcVar11);
    if (gConfig.game != (Game *)0x0) {
      if (gConfig.iterationCount == 0) {
        gConfig.iterationCount = (gConfig.game)->defaultIterationsCount;
      }
      if (gConfig.iterationCount < gConfig.threadCount) {
        gConfig.threadCount = 1;
      }
      if (gConfig.maxDepth == 0) {
        gConfig.maxDepth = (gConfig.game)->defaultMaxDepth;
      }
      *(undefined8 *)((long)adStack_98 + lVar5) = 0x107830;
      randinit(gConfig.seed);
      *(undefined8 *)((long)adStack_98 + lVar5) = 0x107835;
      sim();
      if (gConfig.json == false) {
        *(undefined8 *)((long)adStack_98 + lVar5) = 0x107843;
        dVar21 = getTicks();
        *(undefined8 *)((long)adStack_98 + lVar5) = 0x10785e;
        printf("\x1b[37m        <<<===   \x1b[32mDONE \x1b[31m%0.2f seconds\x1b[37m  ===>>>\x1b[0m\n"
               ,(dVar21 - *(double *)((long)adStack_98 + lVar5 + 8)) / 1000.0);
      }
      return;
    }
  }
LAB_0010786f:
  *(undefined8 *)((long)adStack_98 + lVar5) = 0x107874;
  usage();
LAB_00107874:
  *(undefined8 *)((long)adStack_98 + lVar5) = 0x107889;
  printf("sim %s\n","0.0.1");
  *(undefined8 *)((long)adStack_98 + lVar5) = 0x107890;
  exit(0);
}

Assistant:

void sim(void)
{
	unsigned long i;
	pthread_t threads[gConfig.threadCount];
	Board * startBoard;
	Board * winningStartBoard;
	Results * results;
	Results * totalResults = results_create();
	Card ** cards;
	MovePack * movePack;
	unsigned long cardsCount=0;

	if(gConfig.game->deckCreate==0)
		cards = game_deckCreate(&cardsCount);
	else
		cards = gConfig.game->deckCreate(&cardsCount);

	if(gConfig.json)
	{
		printf("{\"deck\":");
		cards_printAsDeck(cards, cardsCount);
	}

	startBoard = gConfig.game->boardCreate(cards, cardsCount);
	winningStartBoard = board_dup(startBoard);
	free(cards);
	
	// Debug section for new game
	/*board_print(startBoard, false);
	printf("====\n");
	unsigned char movesToMake[] = {0,0,1,1,0,1,1,0,0,0,0,0,0,1};
	for(i=0;i<sizeof(movesToMake);i++)
	{
		board_moveMake(startBoard, gConfig.game->movePackGet(startBoard)->moves[movesToMake[i]]);
	}
	board_print(startBoard, false);
	movePack_print(startBoard, gConfig.game->movePackGet(startBoard), false);
	exit(0);*/

	if(!gConfig.json && !gConfig.printSolution)
	{
		printf(C_MAGENTA "Total Iterations: " C_CYAN "%s" C_RESET "\n", comma_print(gConfig.iterationCount));
		printf(C_MAGENTA "   Maximum Depth: " C_CYAN "%s" C_RESET "\n", comma_print(gConfig.maxDepth));
		printf(C_MAGENTA "    Thread Count: " C_CYAN "%s" C_RESET "\n", comma_print(gConfig.threadCount));
		printf("\n");
		printf(C_MAGENTA "            Game: " C_CYAN "%s" C_RESET "\n", gConfig.game->idname);
		printf(C_MAGENTA "            Seed: " C_CYAN "%u" C_RESET "\n", gConfig.seed);
		printf("\n");
		printf(C_MAGENTA "           Board: " C_RESET "\n");
		board_print(startBoard, false);
		printf("\n");
		printf(C_MAGENTA "  Starting Moves:" C_RESET "\n");
		movePack = gConfig.game->movePackGet(startBoard);
		movePack_print(startBoard, movePack, false);
		movePack_free(movePack, true);
		printf("\n");

		printf(C_WHITE "        <<<=== " C_GREEN "RUNNING" C_WHITE " ===>>>" C_RESET "\n");
	}

	if(gConfig.threadCount>1)
	{
		for(i=0;i<gConfig.threadCount;i++)
		{
			if(pthread_create(&threads[i], 0, depthFirstThread, startBoard)!=0)
			{
				fprintf(stderr, "Error creating thread %lu!\n", i);
				exit(EXIT_FAILURE);
			}
		}
		
		for(i=0;i<gConfig.threadCount;i++)
		{
			if(pthread_join(threads[i], (void **)&results)!=0)
			{
				fprintf(stderr, "Error joining thread %lu!\n", i);
				exit(EXIT_FAILURE);
			}

			results_add(results, totalResults);
			results_free(results);
		}
	}
	else
	{
		totalResults = depthFirstThread(startBoard);
	}


	if(!gConfig.json)
	{
		printf(C_MAGENTA "       Win Count: " C_YELLOW "%s" C_MAGENTA " out of " C_YELLOW "%s" C_RESET "\n", comma_print(totalResults->winCount), comma_print(gConfig.iterationCount));
		printf(C_MAGENTA "  Win Percentage: " C_YELLOW "%0.4f%%" C_RESET "\n", ((double)totalResults->winCount/(double)gConfig.iterationCount)*100);
	}
	else
	{
		printf(",\"seed\":%u,\"wins\":%lu,\"games\":%lu", gConfig.seed, totalResults->winCount, gConfig.iterationCount);
		printf("}\n");
	}

	if(gConfig.printSolution && winningMoves!=0)
	{
		printf("\nWinning moves:\n");
		i = winningMoves->movesCount-1;
		do
		{
			//board_print(winningStartBoard, false);
			move_print(winningStartBoard, winningMoves->moves[i], true);
			board_moveMake(winningStartBoard, winningMoves->moves[i]);
			if(i==0)
				break;

			i--;
		} while(true);

		movePack_free(winningMoves, true);
	}

	board_free(startBoard);
	board_free(winningStartBoard);
	results_free(totalResults);
}